

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  int *piVar1;
  uint uVar2;
  Fts5StructureSegment *pFVar3;
  undefined8 uVar4;
  int bInsert;
  long lVar5;
  int iVar6;
  long lVar7;
  Fts5StructureSegment **ppFVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long local_48;
  
  if (p->rc != 0) {
    return;
  }
  lVar7 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar7 != 0) {
    pFVar3 = pStruct->aLevel[iLvl].aSeg;
    bInsert = (pFVar3[lVar7 + -1].pgnoLast - pFVar3[lVar7 + -1].pgnoFirst) + 1;
    ppFVar8 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar6 = iLvl;
    do {
      if (iVar6 < 1) {
        iVar9 = 0;
        iVar6 = -1;
        goto LAB_001be0fd;
      }
      uVar2 = *(uint *)((long)ppFVar8 + -0x14);
      iVar6 = iVar6 + -1;
      ppFVar8 = ppFVar8 + -2;
    } while (uVar2 == 0);
    uVar10 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar10;
    }
    iVar9 = 0;
    for (; uVar11 * 0xc - uVar10 != 0; uVar10 = uVar10 + 0xc) {
      iVar12 = *(int *)((long)&(*ppFVar8)->pgnoLast + uVar10) -
               *(int *)((long)&(*ppFVar8)->pgnoFirst + uVar10);
      if (iVar9 <= iVar12) {
        iVar9 = iVar12 + 1;
      }
    }
    if (iVar9 < bInsert) {
      iVar6 = -1;
      iVar9 = 0;
    }
LAB_001be0fd:
    if (-1 < iVar6) {
      iLvl = iVar6;
      bInsert = iVar9;
    }
    lVar5 = (long)iLvl;
    lVar7 = lVar5;
    if (pStruct->aLevel[lVar5].nMerge == 0) {
      while ((local_48 = lVar7, local_48 + 1 < (long)pStruct->nLevel &&
             (*(int *)&pStruct[1].aLevel[local_48 + -2].aSeg == 0))) {
        uVar11 = (ulong)*(uint *)((long)&pStruct[1].aLevel[local_48 + -2].aSeg + 4);
        lVar13 = uVar11 * 0xc;
        for (; lVar7 = local_48 + 1, 0 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
          if (bInsert < (*(int *)(*(long *)(pStruct[1].aLevel + local_48 + -1) + lVar13 + -4) -
                        *(int *)(*(long *)(pStruct[1].aLevel + local_48 + -1) + lVar13 + -8)) + 1) {
            return;
          }
          fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,bInsert);
          if (p->rc != 0) {
            return;
          }
          pFVar3 = pStruct->aLevel[lVar5].aSeg;
          lVar7 = *(long *)(pStruct[1].aLevel + local_48 + -1);
          pFVar3->pgnoLast = *(int *)(lVar13 + -4 + lVar7);
          uVar4 = *(undefined8 *)(lVar7 + -0xc + lVar13);
          pFVar3->iSegid = (int)uVar4;
          pFVar3->pgnoFirst = (int)((ulong)uVar4 >> 0x20);
          piVar1 = &pStruct->aLevel[lVar5].nSeg;
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)&pStruct[1].aLevel[local_48 + -2].aSeg + 4);
          *piVar1 = *piVar1 + -1;
          lVar13 = lVar13 + -0xc;
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level 
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}